

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Select(w3Interp *this)

{
  int32_t iVar1;
  size_t sVar2;
  w3StackValue *__src;
  undefined1 local_40 [8];
  w3StackValue val2;
  w3Interp *this_local;
  
  val2.label.continuation = (size_t)this;
  iVar1 = w3Stack::pop_i32(&this->super_w3Stack);
  if (iVar1 == 0) {
    __src = w3Stack::top(&this->super_w3Stack);
    memcpy(local_40,__src,0x30);
    w3Stack::pop_value(&this->super_w3Stack);
    w3Stack::pop_value(&this->super_w3Stack);
    w3Stack::push_value(&this->super_w3Stack,(w3StackValue *)local_40);
  }
  else {
    w3Stack::pop_value(&this->super_w3Stack);
    sVar2 = w3Stack::size(&this->super_w3Stack);
    if (sVar2 == 0) {
      AssertFailed("size () >= 1");
    }
    w3Stack::AssertTopIsValue(&this->super_w3Stack);
  }
  return;
}

Assistant:

INTERP (Select)
{
    if (pop_i32 ())
    {
        pop_value ();
        Assert (size () >= 1);
        AssertTopIsValue ();
    }
    else
    {
        const w3StackValue val2 = top ();
        pop_value ();
        pop_value ();
        push_value (val2);
    }
}